

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall
Commands::command_handler_register::Register
          (command_handler_register *this,command_handler *handler,int flags)

{
  function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
  *pfVar1;
  ulong uVar2;
  ulong uVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>,_bool>
  pVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>
  local_c0;
  
  uVar2 = (handler->info).partial_min_chars;
  if (uVar2 == 0) {
    uVar3 = 1;
  }
  else {
    uVar3 = (handler->info).name._M_string_length;
    if (uVar2 <= uVar3) goto LAB_001285e0;
  }
  (handler->info).partial_min_chars = uVar3;
LAB_001285e0:
  if ((flags & 1U) != 0) {
    (handler->info).duty_restrict = true;
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Commands::command_handler_&,_true>
            (&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)handler,
             handler);
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Commands::command_handler>,std::_Select1st<std::pair<std::__cxx11::string_const,Commands::command_handler>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Commands::command_handler>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,Commands::command_handler>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Commands::command_handler>,std::_Select1st<std::pair<std::__cxx11::string_const,Commands::command_handler>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Commands::command_handler>>>
                      *)this,&local_c0);
  if (local_c0.second.f.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_c0.second.f;
    (*local_c0.second.f.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.second.info.optional_arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.second.info.arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.second.info.name._M_dataplus._M_p != &local_c0.second.info.name.field_2) {
    operator_delete(local_c0.second.info.name._M_dataplus._M_p,
                    local_c0.second.info.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
    operator_delete(local_c0.first._M_dataplus._M_p,local_c0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    Console::Wrn("Duplicate command name: %s",(handler->info).name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void command_handler_register::Register(command_handler handler, int flags)
{
	if (handler.info.partial_min_chars < 1)
		handler.info.partial_min_chars = 1;
	else if (handler.info.partial_min_chars > handler.info.name.length())
		handler.info.partial_min_chars = handler.info.name.length();

	if (flags & CMD_FLAG_DUTY_RESTRICT)
		handler.info.duty_restrict = true;

	auto result = handlers.insert(std::make_pair(handler.info.name, handler));

	if (!result.second)
		Console::Wrn("Duplicate command name: %s", handler.info.name.c_str());
}